

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_inflate_change_table_size
              (nghttp2_hd_inflater *inflater,size_t settings_max_dynamic_table_size)

{
  int iVar1;
  
  iVar1 = -0x207;
  if (inflater->state < NGHTTP2_HD_STATE_OPCODE) {
    inflater->settings_hd_table_bufsize_max = settings_max_dynamic_table_size;
    iVar1 = 0;
    if (settings_max_dynamic_table_size < (inflater->ctx).hd_table_bufsize_max) {
      inflater->state = NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE;
      inflater->min_hd_table_bufsize_max = settings_max_dynamic_table_size;
      (inflater->ctx).hd_table_bufsize_max = settings_max_dynamic_table_size;
      iVar1 = 0;
      hd_context_shrink_table_size(&inflater->ctx,(nghttp2_hd_map *)0x0);
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_inflate_change_table_size(
    nghttp2_hd_inflater *inflater, size_t settings_max_dynamic_table_size) {
  switch (inflater->state) {
  case NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE:
  case NGHTTP2_HD_STATE_INFLATE_START:
    break;
  default:
    return NGHTTP2_ERR_INVALID_STATE;
  }

  inflater->settings_hd_table_bufsize_max = settings_max_dynamic_table_size;

  /* It seems that encoder is not required to send dynamic table size
     update if the table size is not changed after applying
     SETTINGS_HEADER_TABLE_SIZE.  RFC 7541 is ambiguous here, but this
     is the intention of the editor.  If new maximum table size is
     strictly smaller than the current negotiated maximum size,
     encoder must send dynamic table size update.  In other cases, we
     cannot expect it to do so. */
  if (inflater->ctx.hd_table_bufsize_max > settings_max_dynamic_table_size) {
    inflater->state = NGHTTP2_HD_STATE_EXPECT_TABLE_SIZE;
    /* Remember minimum value, and validate that encoder sends the
       value less than or equal to this. */
    inflater->min_hd_table_bufsize_max = settings_max_dynamic_table_size;

    inflater->ctx.hd_table_bufsize_max = settings_max_dynamic_table_size;

    hd_context_shrink_table_size(&inflater->ctx, NULL);
  }

  return 0;
}